

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LA32WaveGenerator.cpp
# Opt level: O0

void __thiscall
MT32Emu::LA32IntPartialPair::initPCM
          (LA32IntPartialPair *this,PairType useMaster,Bit16s *pcmWaveAddress,Bit32u pcmWaveLength,
          bool pcmWaveLooped)

{
  bool pcmWaveLooped_local;
  Bit32u pcmWaveLength_local;
  Bit16s *pcmWaveAddress_local;
  PairType useMaster_local;
  LA32IntPartialPair *this_local;
  
  if (useMaster == MASTER) {
    LA32WaveGenerator::initPCM(&this->master,pcmWaveAddress,pcmWaveLength,pcmWaveLooped,true);
  }
  else {
    LA32WaveGenerator::initPCM
              (&this->slave,pcmWaveAddress,pcmWaveLength,pcmWaveLooped,
               (bool)((this->ringModulated ^ 0xffU) & 1));
  }
  return;
}

Assistant:

void LA32IntPartialPair::initPCM(const PairType useMaster, const Bit16s *pcmWaveAddress, const Bit32u pcmWaveLength, const bool pcmWaveLooped) {
	if (useMaster == MASTER) {
		master.initPCM(pcmWaveAddress, pcmWaveLength, pcmWaveLooped, true);
	} else {
		slave.initPCM(pcmWaveAddress, pcmWaveLength, pcmWaveLooped, !ringModulated);
	}
}